

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDataSource.h
# Opt level: O0

uint32_t __thiscall libssio::FileDataSource::read4(FileDataSource *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar b3;
  uchar b2;
  uchar b1;
  uchar b0;
  FileDataSource *this_local;
  
  iVar1 = fgetc((FILE *)this->f);
  iVar2 = fgetc((FILE *)this->f);
  iVar3 = fgetc((FILE *)this->f);
  iVar4 = fgetc((FILE *)this->f);
  return CONCAT13((char)iVar4,CONCAT12((char)iVar3,CONCAT11((char)iVar2,(char)iVar1)));
}

Assistant:

uint32_t read4() override
    {
        unsigned char b0, b1, b2, b3;
        b0 = fgetc(f);
        b1 = fgetc(f);
        b2 = fgetc(f);
        b3 = fgetc(f);
        return (b0 | (b1<<8) | (b2<<16) | (b3<<24));
    }